

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phashtable.c
# Opt level: O1

void p_hash_table_free(PHashTable *table)

{
  PHashTableNode *pPVar1;
  PHashTableNode *mem;
  ulong uVar2;
  
  if (table == (PHashTable *)0x0) {
    return;
  }
  if (table->size != 0) {
    uVar2 = 0;
    do {
      mem = table->table[uVar2];
      while (mem != (PHashTableNode *)0x0) {
        pPVar1 = mem->next;
        p_free(mem);
        mem = pPVar1;
      }
      uVar2 = (ulong)((int)uVar2 + 1);
    } while (uVar2 < table->size);
  }
  p_free(table->table);
  p_free(table);
  return;
}

Assistant:

P_LIB_API void
p_hash_table_free (PHashTable *table)
{
	PHashTableNode	*node;
	PHashTableNode	*next_node;
	puint		i;

	if (P_UNLIKELY (table == NULL))
		return;

	for (i = 0; i < table->size; ++i)
		for (node = table->table[i]; node != NULL; ) {
			next_node = node->next;
			p_free (node);
			node = next_node;
		}

	p_free (table->table);
	p_free (table);
}